

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int select_add(event_base *base,int fd,short old,short events,void *p)

{
  selectop *sop_00;
  int iVar1;
  int local_34;
  int fdsz;
  selectop *sop;
  void *p_local;
  short events_local;
  short old_local;
  int fd_local;
  event_base *base_local;
  
  sop_00 = (selectop *)base->evbase;
  if ((events & 8U) != 0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/select.c"
               ,0x101,"(events & EV_SIGNAL) == 0","select_add");
  }
  if (sop_00->event_fds < fd) {
    local_34 = sop_00->event_fdsz;
    if (local_34 < 8) {
      local_34 = 8;
    }
    for (; local_34 < (fd + 0x40) / 0x40 << 3; local_34 = local_34 << 1) {
    }
    if ((local_34 != sop_00->event_fdsz) && (iVar1 = select_resize(sop_00,local_34), iVar1 != 0)) {
      return -1;
    }
    sop_00->event_fds = fd;
  }
  if ((events & 2U) != 0) {
    sop_00->event_readset_in->fds_bits[fd / 0x40] =
         1L << ((byte)((long)fd % 0x40) & 0x3f) | sop_00->event_readset_in->fds_bits[fd / 0x40];
  }
  if ((events & 4U) != 0) {
    sop_00->event_writeset_in->fds_bits[fd / 0x40] =
         1L << ((byte)((long)fd % 0x40) & 0x3f) | sop_00->event_writeset_in->fds_bits[fd / 0x40];
  }
  return 0;
}

Assistant:

static int
select_add(struct event_base *base, int fd, short old, short events, void *p)
{
	struct selectop *sop = base->evbase;
	(void) p;

	EVUTIL_ASSERT((events & EV_SIGNAL) == 0);
	check_selectop(sop);
	/*
	 * Keep track of the highest fd, so that we can calculate the size
	 * of the fd_sets for select(2)
	 */
	if (sop->event_fds < fd) {
		int fdsz = sop->event_fdsz;

		if (fdsz < (int)sizeof(fd_mask))
			fdsz = (int)sizeof(fd_mask);

		/* In theory we should worry about overflow here.  In
		 * reality, though, the highest fd on a unixy system will
		 * not overflow here. XXXX */
		while (fdsz < (int) SELECT_ALLOC_SIZE(fd + 1))
			fdsz *= 2;

		if (fdsz != sop->event_fdsz) {
			if (select_resize(sop, fdsz)) {
				check_selectop(sop);
				return (-1);
			}
		}

		sop->event_fds = fd;
	}

	if (events & EV_READ)
		FD_SET(fd, sop->event_readset_in);
	if (events & EV_WRITE)
		FD_SET(fd, sop->event_writeset_in);
	check_selectop(sop);

	return (0);
}